

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O0

void __thiscall
QPlainTextDocumentLayout::layoutBlock(QPlainTextDocumentLayout *this,QTextBlock *block)

{
  bool bVar1;
  Int IVar2;
  int iVar3;
  int iVar4;
  QPlainTextDocumentLayoutPrivate *pQVar5;
  QTextOption *pQVar6;
  double *pdVar7;
  ulong uVar8;
  QTextEngine *extraout_RDX;
  QTextBlock *in_RSI;
  QSizeF *in_RDI;
  long in_FS_OFFSET;
  double xpos;
  double dVar9;
  qreal qVar10;
  qreal blockMaximumWidth_1;
  bool emitDocumentSizeChanged;
  int lineCount;
  int previousLineCount;
  qreal availableWidth;
  int extraMargin;
  QTextLayout *tl;
  qreal height;
  qreal margin;
  QTextDocument *doc;
  QPlainTextDocumentLayoutPrivate *d;
  QTextLine line;
  QFontMetrics fm;
  QTextOption option;
  qreal blockMaximumWidth;
  QTextBlock maximumBlock;
  QTextBlock b;
  Flag in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  bool local_119;
  double local_110;
  int local_104;
  double local_f8;
  double local_b8;
  QPointF local_b0;
  QTextLine local_a0;
  QChar local_8a;
  undefined1 *local_88;
  QFlagsStorageHelper<QTextOption::Flag,_4> local_80;
  QFlagsStorageHelper<QTextOption::Flag,_4> local_7c;
  undefined1 *local_78;
  undefined8 local_70;
  undefined1 *local_68;
  double local_60;
  QTextBlock local_58;
  undefined1 local_48 [16];
  undefined1 local_38 [32];
  QFont local_18 [16];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar5 = d_func((QPlainTextDocumentLayout *)0x6be075);
  QAbstractTextDocumentLayout::document();
  xpos = (double)QTextDocument::documentMargin();
  local_60 = 0.0;
  local_f8 = 0.0;
  pQVar6 = (QTextOption *)QTextBlock::layout();
  local_78 = &DAT_aaaaaaaaaaaaaaaa;
  local_70 = 0xffffffffffffffff;
  local_68 = &DAT_aaaaaaaaaaaaaaaa;
  QTextDocument::defaultTextOption();
  QTextLayout::setTextOption(pQVar6);
  local_104 = 0;
  local_80.super_QFlagsStorage<QTextOption::Flag>.i =
       (QFlagsStorage<QTextOption::Flag>)
       QTextOption::flags((QTextOption *)
                          CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0));
  local_7c.super_QFlagsStorage<QTextOption::Flag>.i =
       (QFlagsStorage<QTextOption::Flag>)
       QFlags<QTextOption::Flag>::operator&
                 ((QFlags<QTextOption::Flag> *)
                  CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                  in_stack_fffffffffffffebc);
  IVar2 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_7c);
  if (IVar2 != 0) {
    local_88 = &DAT_aaaaaaaaaaaaaaaa;
    QTextBlock::charFormat();
    QTextCharFormat::font();
    QFontMetrics::QFontMetrics((QFontMetrics *)&local_88,local_18);
    QFont::~QFont(local_18);
    QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x6be1be);
    QChar::QChar<int,_true>(&local_8a,0x21b5);
    local_104 = QFontMetrics::horizontalAdvance((QChar *)&local_88);
    QFontMetrics::~QFontMetrics((QFontMetrics *)&local_88);
  }
  QTextLayout::beginLayout();
  local_110 = pQVar5->width;
  if (local_110 <= 0.0) {
    local_110 = 2147483647.0;
  }
  while( true ) {
    local_a0._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_a0.eng = (QTextEngine *)&DAT_aaaaaaaaaaaaaaaa;
    iVar3 = QTextLayout::createLine();
    local_a0.index = iVar3;
    local_a0.eng = extraout_RDX;
    bVar1 = QTextLine::isValid(&local_a0);
    if (!bVar1) break;
    QTextLine::setLeadingIncluded(SUB81(&local_a0,0));
    QTextLine::setLineWidth(local_110 - (xpos + xpos + (double)local_104));
    QPointF::QPointF(&local_b0,xpos,local_f8);
    QTextLine::setPosition((QPointF *)&local_a0);
    dVar9 = (double)QTextLine::height();
    local_f8 = dVar9 + local_f8;
    dVar9 = (double)QTextLine::leading();
    if (dVar9 < 0.0) {
      QTextLine::leading();
      iVar3 = qCeil<double>(3.49330201836474e-317);
      local_f8 = (double)iVar3 + local_f8;
    }
    local_b8 = (double)QTextLine::naturalTextWidth();
    local_b8 = xpos + xpos + local_b8;
    pdVar7 = qMax<double>(&local_60,&local_b8);
    local_60 = *pdVar7;
  }
  QTextLayout::endLayout();
  iVar3 = QTextDocument::lineCount();
  uVar8 = QTextBlock::isVisible();
  if ((uVar8 & 1) != 0) {
    QTextLayout::lineCount();
  }
  QTextBlock::setLineCount((int)in_RSI);
  iVar4 = QTextDocument::lineCount();
  local_119 = iVar3 != iVar4;
  if (local_60 < pQVar5->maximumWidth || local_60 == pQVar5->maximumWidth) {
    iVar3 = QTextBlock::blockNumber();
    if ((iVar3 == pQVar5->maximumWidthBlockNumber) && (local_60 < pQVar5->maximumWidth)) {
      local_38._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_38._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextDocument::firstBlock();
      pQVar5->maximumWidth = 0.0;
      local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
      QTextBlock::QTextBlock((QTextBlock *)local_48);
      while (uVar8 = QTextBlock::isValid(), (uVar8 & 1) != 0) {
        qVar10 = blockWidth((QPlainTextDocumentLayout *)in_RDI,in_RSI);
        if (pQVar5->maximumWidth <= qVar10 && qVar10 != pQVar5->maximumWidth) {
          pQVar5->maximumWidth = qVar10;
          QTextBlock::operator=((QTextBlock *)local_48,(QTextBlock *)local_38);
        }
        QTextBlock::next();
        QTextBlock::operator=((QTextBlock *)local_38,&local_58);
      }
      uVar8 = QTextBlock::isValid();
      bVar1 = (uVar8 & 1) != 0;
      if (bVar1) {
        iVar3 = QTextBlock::blockNumber();
        pQVar5->maximumWidthBlockNumber = iVar3;
      }
      local_119 = bVar1 || local_119;
    }
  }
  else {
    pQVar5->maximumWidth = local_60;
    iVar3 = QTextBlock::blockNumber();
    pQVar5->maximumWidthBlockNumber = iVar3;
    local_119 = true;
  }
  if ((local_119) && ((pQVar5->blockDocumentSizeChanged & 1U) == 0)) {
    (**(code **)(*(long *)&in_RDI->wd + 0x78))();
    QAbstractTextDocumentLayout::documentSizeChanged(in_RDI);
  }
  QTextOption::~QTextOption((QTextOption *)&local_78);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QPlainTextDocumentLayout::layoutBlock(const QTextBlock &block)
{
    Q_D(QPlainTextDocumentLayout);
    QTextDocument *doc = document();
    qreal margin = doc->documentMargin();
    qreal blockMaximumWidth = 0;

    qreal height = 0;
    QTextLayout *tl = block.layout();
    QTextOption option = doc->defaultTextOption();
    tl->setTextOption(option);

    int extraMargin = 0;
    if (option.flags() & QTextOption::AddSpaceForLineAndParagraphSeparators) {
        QFontMetrics fm(block.charFormat().font());
        extraMargin += fm.horizontalAdvance(QChar(0x21B5));
    }
    tl->beginLayout();
    qreal availableWidth = d->width;
    if (availableWidth <= 0) {
        availableWidth = qreal(INT_MAX); // similar to text edit with pageSize.width == 0
    }
    availableWidth -= 2*margin + extraMargin;
    while (1) {
        QTextLine line = tl->createLine();
        if (!line.isValid())
            break;
        line.setLeadingIncluded(true);
        line.setLineWidth(availableWidth);
        line.setPosition(QPointF(margin, height));
        height += line.height();
        if (line.leading() < 0)
            height += qCeil(line.leading());
        blockMaximumWidth = qMax(blockMaximumWidth, line.naturalTextWidth() + 2*margin);
    }
    tl->endLayout();

    int previousLineCount = doc->lineCount();
    const_cast<QTextBlock&>(block).setLineCount(block.isVisible() ? tl->lineCount() : 0);
    int lineCount = doc->lineCount();

    bool emitDocumentSizeChanged = previousLineCount != lineCount;
    if (blockMaximumWidth > d->maximumWidth) {
        // new longest line
        d->maximumWidth = blockMaximumWidth;
        d->maximumWidthBlockNumber = block.blockNumber();
        emitDocumentSizeChanged = true;
    } else if (block.blockNumber() == d->maximumWidthBlockNumber && blockMaximumWidth < d->maximumWidth) {
        // longest line shrinking
        QTextBlock b = doc->firstBlock();
        d->maximumWidth = 0;
        QTextBlock maximumBlock;
        while (b.isValid()) {
            qreal blockMaximumWidth = blockWidth(b);
            if (blockMaximumWidth > d->maximumWidth) {
                d->maximumWidth = blockMaximumWidth;
                maximumBlock = b;
            }
            b = b.next();
        }
        if (maximumBlock.isValid()) {
            d->maximumWidthBlockNumber = maximumBlock.blockNumber();
            emitDocumentSizeChanged = true;
        }
    }
    if (emitDocumentSizeChanged && !d->blockDocumentSizeChanged)
        emit documentSizeChanged(documentSize());
}